

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar1;
  Location loc;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_60;
  GlobalModuleField *local_58;
  Location local_50;
  
  __s = this->filename_;
  aVar1.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_50.field_1.field_0.last_column = 0;
  local_50.filename.size_ = strlen(__s);
  local_50.filename.data_ = __s;
  local_50.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar1.offset;
  MakeUnique<wabt::GlobalModuleField,wabt::Location>((wabt *)&local_58,&local_50);
  (local_58->global).type.enum_ = type.enum_;
  (local_58->global).mutable_ = mutable_;
  local_60._M_head_impl = local_58;
  local_58 = (GlobalModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                       *)&local_60);
  if (local_60._M_head_impl != (GlobalModuleField *)0x0) {
    (*((local_60._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_60._M_head_impl = (GlobalModuleField *)0x0;
  if (local_58 != (GlobalModuleField *)0x0) {
    (**(code **)(*(long *)local_58 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = MakeUnique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  return Result::Ok;
}